

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall Equality_clone_Test::TestBody(Equality_clone_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  shared_ptr *psVar2;
  char cVar3;
  AssertionResult gtest_ar_;
  ImporterPtr importer;
  ParserPtr parser;
  AssertionResult local_a8;
  long local_98 [2];
  long *local_88;
  AssertHelper local_80 [8];
  long *local_78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  long local_68 [2];
  shared_ptr *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_50;
  shared_ptr *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_40;
  shared_ptr *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"modelflattening/outsidecomponentequivalentvariables.xml","");
  fileContents((string *)&local_a8);
  libcellml::Parser::parseModel((string *)&local_58);
  if ((shared_ptr *)local_a8._0_8_ != (shared_ptr *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  libcellml::Model::clone();
  libcellml::Importer::create(SUB81(&local_38,0));
  psVar2 = local_38;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"modelflattening/","");
  resourcePath((string *)&local_a8);
  libcellml::Importer::resolveImports(psVar2,(string *)&local_58);
  if ((shared_ptr *)local_a8._0_8_ != (shared_ptr *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  libcellml::Importer::flattenModel((shared_ptr *)&local_a8);
  pbVar1 = pbStack_50;
  pbStack_50 = local_a8.message_.ptr_;
  local_58 = (shared_ptr *)local_a8._0_8_;
  local_a8._0_8_ = (shared_ptr *)0x0;
  local_a8.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar1),
     local_a8.message_.ptr_ !=
     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.message_.ptr_);
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"modelflattening/","");
  resourcePath((string *)&local_a8);
  libcellml::Importer::resolveImports(local_38,(string *)&local_48);
  if ((shared_ptr *)local_a8._0_8_ != (shared_ptr *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  libcellml::Importer::flattenModel((shared_ptr *)&local_a8);
  pbVar1 = pbStack_40;
  pbStack_40 = local_a8.message_.ptr_;
  local_48 = (shared_ptr *)local_a8._0_8_;
  local_a8.success_ = false;
  local_a8._1_7_ = 0;
  local_a8.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar1),
     local_a8.message_.ptr_ !=
     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.message_.ptr_);
  }
  local_a8._0_8_ = local_48;
  local_a8.message_.ptr_ = pbStack_40;
  if (pbStack_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&pbStack_40->_M_string_length = (int)pbStack_40->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&pbStack_40->_M_string_length = (int)pbStack_40->_M_string_length + 1;
    }
  }
  cVar3 = libcellml::Entity::equals(local_58);
  local_78 = (long *)CONCAT71(local_78._1_7_,cVar3);
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_a8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (cVar3 == '\0') goto LAB_00122f65;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.message_.ptr_);
    if (((ulong)local_78 & 1) == 0) {
LAB_00122f65:
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_a8,(char *)&local_78,"model->equals(clonedModel)","false");
      testing::internal::AssertHelper::AssertHelper
                (local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
                 ,0x3e3,(char *)local_a8._0_8_);
      testing::internal::AssertHelper::operator=(local_80,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(local_80);
      if ((shared_ptr *)local_a8._0_8_ != (shared_ptr *)local_98) {
        operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
      }
      if (((local_88 != (long *)0x0) && (cVar3 = testing::internal::IsTrue(true), cVar3 != '\0')) &&
         (local_88 != (long *)0x0)) {
        (**(code **)(*local_88 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8._0_8_ = local_58;
  local_a8.message_.ptr_ = pbStack_50;
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&pbStack_50->_M_string_length = (int)pbStack_50->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&pbStack_50->_M_string_length = (int)pbStack_50->_M_string_length + 1;
    }
  }
  cVar3 = libcellml::Entity::equals(local_48);
  local_78 = (long *)CONCAT71(local_78._1_7_,cVar3);
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_a8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (cVar3 != '\0') goto LAB_0012311b;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.message_.ptr_);
    if (((ulong)local_78 & 1) != 0) goto LAB_0012311b;
  }
  testing::Message::Message((Message *)&local_88);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_a8,(char *)&local_78,"clonedModel->equals(model)","false");
  testing::internal::AssertHelper::AssertHelper
            (local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
             ,0x3e4,(char *)local_a8._0_8_);
  testing::internal::AssertHelper::operator=(local_80,(Message *)&local_88);
  testing::internal::AssertHelper::~AssertHelper(local_80);
  if ((shared_ptr *)local_a8._0_8_ != (shared_ptr *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  if (((local_88 != (long *)0x0) && (cVar3 = testing::internal::IsTrue(true), cVar3 != '\0')) &&
     (local_88 != (long *)0x0)) {
    (**(code **)(*local_88 + 8))();
  }
LAB_0012311b:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (pbStack_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_40);
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_50);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Equality, clone)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("modelflattening/outsidecomponentequivalentvariables.xml"));
    auto clonedModel = model->clone();
    auto importer = libcellml::Importer::create();
    importer->resolveImports(model, resourcePath("modelflattening/"));
    model = importer->flattenModel(model);

    importer->resolveImports(clonedModel, resourcePath("modelflattening/"));
    clonedModel = importer->flattenModel(clonedModel);

    EXPECT_TRUE(model->equals(clonedModel));
    EXPECT_TRUE(clonedModel->equals(model));
}